

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void summon_char(CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  int iVar2;
  void *in_RSI;
  CHAR_DATA *in_RDI;
  CHAR_DATA *unaff_retaddr;
  ROOM_INDEX_DATA *in_stack_00000018;
  CHAR_DATA *in_stack_00000020;
  CHAR_DATA *in_stack_00000040;
  char *in_stack_00005c40;
  CHAR_DATA *in_stack_00005c48;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  
  bVar1 = is_npc(in_stack_ffffffffffffffe8);
  if ((((bVar1) ||
       (in_RDI->in_room->area == *(AREA_DATA_conflict **)(*(long *)((long)in_RSI + 0xa8) + 0x30)))
      || ((bVar1 = is_adjacent_area(in_RDI->in_room->area,
                                    *(AREA_DATA_conflict **)(*(long *)((long)in_RSI + 0xa8) + 0x30))
          , bVar1 && (iVar2 = number_percent(), 0x46 < iVar2)))) ||
     (iVar2 = number_percent(), iVar2 < 7)) {
    act((char *)unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8,0);
    char_from_room(in_stack_00000040);
    char_to_room(in_stack_00000020,in_stack_00000018);
    check_zombie_summon(in_stack_ffffffffffffffe8);
    act((char *)unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8,0);
    act((char *)unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8,0);
    iVar2 = (int)((ulong)in_RDI >> 0x20);
    do_look(in_stack_00005c48,in_stack_00005c40);
    check_plasma_thread(unaff_retaddr,iVar2);
    bVar1 = is_npc(in_stack_ffffffffffffffe8);
    if (bVar1) {
      *(undefined1 *)((long)in_RSI + 0x334) = 1;
    }
  }
  else {
    act((char *)unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8,0);
  }
  return;
}

Assistant:

void summon_char(CHAR_DATA *ch, CHAR_DATA *victim)
{
	// same area OR 36% chance in adjacent OR 6% chance if they totally got away
	if (is_npc(victim)
		|| ch->in_room->area == victim->in_room->area
		|| (is_adjacent_area(ch->in_room->area, victim->in_room->area) && number_percent() > 70) // 30% chance + 6%
		|| number_percent() < 7)
	{
		act("$n disappears suddenly.", victim, nullptr, nullptr, TO_ROOM);

		char_from_room(victim);
		char_to_room(victim, ch->in_room);

		check_zombie_summon(victim);

		act("$n arrives suddenly.", victim, nullptr, nullptr, TO_ROOM);
		act("$n has summoned you!", ch, nullptr, victim, TO_VICT);

		do_look(victim, "auto");

		check_plasma_thread(victim, -1);

		if (is_npc(victim))
			victim->law_pass = true; // summoned mobs give less xp

		return;
	}

	act("The summoning of $N fails as $E escapes your grasp.", ch, 0, victim, TO_CHAR);
}